

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O0

int64_t safe_add_int64_int32(int64_t a,int32_t b)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  int64_t tmp;
  
  lVar1 = in_RDI + in_ESI;
  if (in_RDI < 0) {
    if ((in_ESI < 0) && (in_RDI < lVar1)) {
      safe_math_fail((char *)tmp);
    }
  }
  else if ((-1 < in_ESI) && (lVar1 < in_RDI)) {
    safe_math_fail((char *)tmp);
  }
  return lVar1;
}

Assistant:

static inline int64_t safe_add_int64_int32(int64_t a, int32_t b)
{
    int64_t tmp = (int64_t)((uint64_t)a + (uint64_t)b);

    if (a >= 0)
    {
        // mixed sign cannot overflow
        if (b >= 0 && tmp < a)
            safe_math_fail("safe_math_fail safe_add_int64_int32");
    }
    else
    {
        // lhs negative
        if (b < 0 && tmp > a)
            safe_math_fail("safe_math_fail safe_add_int64_int32");
    }

    return tmp;
}